

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O2

bool __thiscall cmParseCacheCoverage::LoadCoverageData(cmParseCacheCoverage *this,char *d)

{
  bool bVar1;
  char *pcVar2;
  uint uVar3;
  Directory dir;
  string file;
  string path;
  Directory local_b0;
  string local_a8;
  cmParseCacheCoverage *local_88;
  char *local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_88 = this;
  cmsys::Directory::Directory(&local_b0);
  local_80 = d;
  std::__cxx11::string::string((string *)&local_a8,d,(allocator *)&local_70);
  bVar1 = cmsys::Directory::Load(&local_b0,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar1) {
    local_78 = cmsys::Directory::GetNumberOfFiles(&local_b0);
    for (uVar3 = 0; uVar3 < local_78; uVar3 = uVar3 + 1) {
      pcVar2 = cmsys::Directory::GetFile(&local_b0,(ulong)uVar3);
      std::__cxx11::string::string((string *)&local_a8,pcVar2,(allocator *)&local_70);
      bVar1 = std::operator!=(&local_a8,".");
      if (bVar1) {
        bVar1 = std::operator!=(&local_a8,"..");
        if (bVar1) {
          bVar1 = cmsys::SystemTools::FileIsDirectory(&local_a8);
          if (!bVar1) {
            std::__cxx11::string::string((string *)&local_70,local_80,(allocator *)&local_50);
            std::__cxx11::string::append((char *)&local_70);
            std::__cxx11::string::append((string *)&local_70);
            cmsys::SystemTools::GetFilenameLastExtension(&local_50,&local_70);
            bVar1 = std::operator==(&local_50,".cmcov");
            std::__cxx11::string::~string((string *)&local_50);
            if (bVar1) {
              bVar1 = ReadCMCovFile(local_88,local_70._M_dataplus._M_p);
              if (!bVar1) {
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::string::~string((string *)&local_a8);
                goto LAB_00301d09;
              }
            }
            std::__cxx11::string::~string((string *)&local_70);
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_a8);
    }
    bVar1 = true;
  }
  else {
LAB_00301d09:
    bVar1 = false;
  }
  cmsys::Directory::~Directory(&local_b0);
  return bVar1;
}

Assistant:

bool cmParseCacheCoverage::LoadCoverageData(const char* d)
{
  // load all the .mcov files in the specified directory
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = d;
      path += "/";
      path += file;
      if (cmSystemTools::GetFilenameLastExtension(path) == ".cmcov") {
        if (!this->ReadCMCovFile(path.c_str())) {
          return false;
        }
      }
    }
  }
  return true;
}